

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O3

vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
* __thiscall
polyscope::CameraParameters::generateCameraRays
          (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           *__return_storage_ptr__,CameraParameters *this,size_t dimX,size_t dimY,ImageOrigin origin
          )

{
  undefined8 uVar1;
  pointer pvVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar16 [56];
  undefined1 auVar14 [64];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 in_XMM4 [16];
  vec3 vVar19;
  vec<3,_float,_(glm::qualifier)0> vVar20;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  mat4x4 viewMat;
  size_t local_110;
  long local_108;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  size_t local_f0;
  undefined1 local_e8 [16];
  long local_d0;
  vec<4,_float,_(glm::qualifier)0> local_c8;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_b8;
  undefined1 local_b4 [16];
  float fStack_a4;
  undefined8 uStack_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined4 local_80;
  undefined4 uStack_7c;
  mat<4,_4,_float,_(glm::qualifier)0> local_78;
  undefined1 auVar15 [64];
  
  local_78.value[0].field_0 = (this->extrinsics).E.value[0].field_0;
  local_78.value[0].field_1 = (this->extrinsics).E.value[0].field_1;
  local_78.value[0].field_2 = (this->extrinsics).E.value[0].field_2;
  local_78.value[0].field_3 = (this->extrinsics).E.value[0].field_3;
  local_78.value[1].field_0 = (this->extrinsics).E.value[1].field_0;
  local_78.value[1].field_1 = (this->extrinsics).E.value[1].field_1;
  local_78.value[1].field_2 = (this->extrinsics).E.value[1].field_2;
  local_78.value[1].field_3 = (this->extrinsics).E.value[1].field_3;
  local_78.value[2].field_0 = (this->extrinsics).E.value[2].field_0;
  local_78.value[2].field_1 = (this->extrinsics).E.value[2].field_1;
  local_78.value[2].field_2 = (this->extrinsics).E.value[2].field_2;
  local_78.value[2].field_3 = (this->extrinsics).E.value[2].field_3;
  local_78.value[3].field_0 = (this->extrinsics).E.value[3].field_0;
  local_78.value[3].field_1 = (this->extrinsics).E.value[3].field_1;
  local_78.value[3].field_2 = (this->extrinsics).E.value[3].field_2;
  local_78.value[3].field_3 = (this->extrinsics).E.value[3].field_3;
  local_e8._0_4_ = (this->intrinsics).aspectRatioWidthOverHeight;
  fVar11 = tanf((this->intrinsics).fovVerticalDegrees * 0.017453292 * 0.5);
  local_b4 = ZEXT816(0) << 0x40;
  local_c8.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_c8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_94 = 0;
  uStack_88 = 0;
  uStack_7c = 0;
  fStack_a4 = 2.0 / (fVar11 + fVar11);
  local_b8.x = 2.0 / (fVar11 * (float)local_e8._0_4_ + fVar11 * (float)local_e8._0_4_);
  auVar12._8_4_ = 0xbf800000;
  auVar12._0_8_ = 0xbf800000bf800000;
  auVar12._12_4_ = 0xbf800000;
  local_90 = vmovlps_avx(auVar12);
  auVar12 = vcvtusi2ss_avx512f(in_XMM4,dimX);
  local_80 = 0xc0000000;
  local_c8.field_2 = auVar12._0_4_;
  auVar12 = vcvtusi2ss_avx512f(in_XMM4,dimY);
  local_c8.field_3 = auVar12._0_4_;
  auVar16 = ZEXT856(auVar12._8_8_);
  vVar19 = CameraExtrinsics::getPosition(&this->extrinsics);
  auVar15._0_8_ = vVar19._0_8_;
  auVar15._8_56_ = auVar16;
  local_e8 = auVar15._0_16_;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(__return_storage_ptr__,dimY * dimX,(allocator_type *)&local_fc);
  if (dimY != 0) {
    local_110 = 0;
    local_d0 = dimX * 0xc;
    local_108 = 8;
    local_f0 = dimY;
    do {
      if (dimX != 0) {
        sVar8 = 0;
        sVar10 = local_f0 - local_110;
        lVar9 = local_108;
        do {
          auVar16 = auVar15._8_56_;
          sVar7 = sVar10;
          if ((origin == UpperLeft) || (sVar7 = local_110, origin == LowerLeft)) {
            auVar12 = vcvtusi2ss_avx512f(in_XMM4,sVar7);
            auVar16 = ZEXT856(auVar12._8_8_);
            auVar13 = vcvtusi2ss_avx512f(in_XMM4,sVar8);
            local_fc = auVar13._0_4_;
            local_f8 = auVar12._0_4_;
            local_f4 = 0;
          }
          vVar20 = glm::unProjectNO<float,float,(glm::qualifier)0>
                             ((vec<3,_float,_(glm::qualifier)0> *)&local_fc,&local_78,
                              (mat<4,_4,_float,_(glm::qualifier)0> *)&local_b8,&local_c8);
          auVar14._0_8_ = vVar20._0_8_;
          auVar14._8_56_ = auVar16;
          auVar12 = vsubps_avx(auVar14._0_16_,local_e8);
          fVar6 = vVar20.field_2.z - vVar19.field_2.z;
          pvVar2 = (__return_storage_ptr__->
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          sVar8 = sVar8 + 1;
          fVar11 = auVar12._0_4_;
          auVar18._0_4_ = fVar11 * fVar11;
          fVar3 = auVar12._4_4_;
          auVar18._4_4_ = fVar3 * fVar3;
          fVar4 = auVar12._8_4_;
          auVar18._8_4_ = fVar4 * fVar4;
          fVar5 = auVar12._12_4_;
          auVar18._12_4_ = fVar5 * fVar5;
          auVar12 = vhaddps_avx(auVar18,auVar18);
          auVar12 = ZEXT416((uint)(fVar6 * fVar6 + auVar12._0_4_));
          auVar12 = vsqrtss_avx(auVar12,auVar12);
          fVar17 = 1.0 / auVar12._0_4_;
          auVar13._0_4_ = fVar11 * fVar17;
          auVar13._4_4_ = fVar3 * fVar17;
          auVar13._8_4_ = fVar4 * fVar17;
          auVar13._12_4_ = fVar5 * fVar17;
          auVar15 = ZEXT1664(auVar13);
          uVar1 = vmovlps_avx(auVar13);
          *(undefined8 *)((long)pvVar2 + lVar9 + -8) = uVar1;
          *(float *)((long)&pvVar2->field_0 + lVar9) = fVar6 * fVar17;
          lVar9 = lVar9 + 0xc;
        } while (dimX != sVar8);
      }
      local_108 = local_108 + local_d0;
      local_110 = local_110 + 1;
    } while (local_110 != local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<glm::vec3> CameraParameters::generateCameraRays(size_t dimX, size_t dimY, ImageOrigin origin) const {

  // TODO this has not been tested for the case where dimX/dimY do not match the aspectRatio for the cameraParams

  // prep values
  glm::mat4x4 viewMat = getViewMat();
  glm::mat4 projMat =
      glm::infinitePerspective(glm::radians(getFoVVerticalDegrees()), getAspectRatioWidthOverHeight(), 1.f);
  glm::vec4 viewport = {0., 0., dimX, dimY};
  glm::vec3 rootPos = getPosition();
  size_t nPix = dimX * dimY;

  // allocate output
  std::vector<glm::vec3> result(dimX * dimY);

  // populate the rays
  for (size_t iY = 0; iY < dimY; iY++) {
    for (size_t iX = 0; iX < dimX; iX++) {

      // populate the rays
      // (this arithmetic could certainly be optimized)

      glm::vec3 screenPos3;
      switch (origin) {
      case ImageOrigin::UpperLeft:
        screenPos3 = glm::vec3{iX, dimY - iY, 0.};
        break;
      case ImageOrigin::LowerLeft:
        screenPos3 = glm::vec3{iX, iY, 0.};
        break;
      }

      glm::vec3 worldPos = glm::unProject(screenPos3, viewMat, projMat, viewport);
      glm::vec3 worldRayDir = glm::normalize(worldPos - rootPos);

      size_t ind = iY * dimX + iX;
      result[ind] = worldRayDir;
    }
  }

  return result;
}